

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_solver_utilities.cpp
# Opt level: O1

void __thiscall
solver_utilites_update_convergence_Test::~solver_utilites_update_convergence_Test
          (solver_utilites_update_convergence_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(solver_utilites, update_convergence) {

  auto start_time = std::chrono::steady_clock::now();
  Convergence_Data data;
  // Test that which must be correct after instantiation.
  EXPECT_EQ(data.iteration, 0);
  EXPECT_GT(data.start_time, start_time);

  // construct system
  Matrix_Sparse matrix_sparse(5, 5);
  matrix_sparse[0][0] = 0.5;
  matrix_sparse[1][1] = 0.5;
  matrix_sparse[2][2] = 0.5;
  matrix_sparse[3][3] = 0.5;
  matrix_sparse[4][4] = 0.5;
  Vector_Dense<Scalar, 0> solution;
  solution.resize(5, 2.0);
  Vector_Dense<Scalar, 0> constant = {3.0, -1.0, 3.0, -1.0, 3.0};
  auto [weighted_l2_norm_0, l_inf_norm_0] = compute_residual(matrix_sparse, solution, constant);

  // Test that which must be correct after instantiation.
  data.update(matrix_sparse, solution, constant);
  EXPECT_EQ(data.iteration, 1);
  EXPECT_LE(data.duration,
            std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::steady_clock::now() - start_time));
  EXPECT_EQ(data.residual, weighted_l2_norm_0);
  EXPECT_EQ(data.residual_max, l_inf_norm_0);
  EXPECT_EQ(data.residual_0, weighted_l2_norm_0);
  EXPECT_EQ(data.residual_max_0, l_inf_norm_0);
  EXPECT_EQ(data.residual_normalised, 1.0);
  EXPECT_EQ(data.residual_max_normalised, 1.0);

  // Second iteration, check  that which must be correct after instantiation.
  constant = Vector_Dense<Scalar, 0>({2.0, 0.0, 3.0, 0.0, 2.0});
  auto [weighted_l2_norm, l_inf_norm] = compute_residual(matrix_sparse, solution, constant);

  data.update(matrix_sparse, solution, constant);
  EXPECT_EQ(data.iteration, 2);
  EXPECT_LE(data.duration,
            std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::steady_clock::now() - start_time));
  EXPECT_EQ(data.residual, weighted_l2_norm);
  EXPECT_EQ(data.residual_max, l_inf_norm);
  EXPECT_EQ(data.residual_0, weighted_l2_norm_0);
  EXPECT_EQ(data.residual_max_0, l_inf_norm_0);
  EXPECT_EQ(data.residual_normalised, weighted_l2_norm / weighted_l2_norm_0);
  EXPECT_EQ(data.residual_max_normalised, l_inf_norm / l_inf_norm_0);
}